

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathRoundFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  double __x;
  int code;
  xmlXPathObjectPtr pxVar1;
  ulong uVar2;
  double dVar3;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      code = 0x17;
    }
    else {
      pxVar1 = ctxt->value;
      if (pxVar1 != (xmlXPathObjectPtr)0x0) {
        if (pxVar1->type == XPATH_NUMBER) {
LAB_001c07a0:
          __x = pxVar1->floatval;
          if ((__x < -0.5) || (0.5 <= __x)) {
            dVar3 = floor(__x);
            uVar2 = -(ulong)(__x - dVar3 < 0.5);
            pxVar1->floatval = (double)(~uVar2 & (ulong)(dVar3 + 1.0) | (ulong)dVar3 & uVar2);
          }
          else {
            pxVar1->floatval = __x * 0.0;
          }
          return;
        }
        xmlXPathNumberFunction(ctxt,1);
        pxVar1 = ctxt->value;
        if ((pxVar1 != (xmlXPathObjectPtr)0x0) && (pxVar1->type == XPATH_NUMBER)) goto LAB_001c07a0;
      }
      code = 0xb;
    }
  }
  else {
    code = 0xc;
  }
  xmlXPathErr(ctxt,code);
  return;
}

Assistant:

void
xmlXPathRoundFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    double f;

    CHECK_ARITY(1);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);

    f = ctxt->value->floatval;

    if ((f >= -0.5) && (f < 0.5)) {
        /* Handles negative zero. */
        ctxt->value->floatval *= 0.0;
    }
    else {
        double rounded = floor(f);
        if (f - rounded >= 0.5)
            rounded += 1.0;
        ctxt->value->floatval = rounded;
    }
}